

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_send(connectdata *conn,ssize_t len,size_t upload_size)

{
  size_t sStack_38;
  CURLcode result;
  ssize_t bytes_written;
  smb_conn *smbc;
  size_t upload_size_local;
  ssize_t len_local;
  connectdata *conn_local;
  
  bytes_written = (ssize_t)&conn->proto;
  smbc = (smb_conn *)upload_size;
  upload_size_local = len;
  len_local = (ssize_t)conn;
  conn_local._4_4_ =
       Curl_write(conn,0,(conn->data->state).uploadbuffer,len,(ssize_t *)&stack0xffffffffffffffc8);
  if (conn_local._4_4_ == CURLE_OK) {
    if (sStack_38 != upload_size_local) {
      *(size_t *)(bytes_written + 0x38) = upload_size_local;
      *(size_t *)(bytes_written + 0x40) = sStack_38;
    }
    *(smb_conn **)(bytes_written + 0x30) = smbc;
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode smb_send(struct connectdata *conn, ssize_t len,
                         size_t upload_size)
{
  struct smb_conn *smbc = &conn->proto.smbc;
  ssize_t bytes_written;
  CURLcode result;

  result = Curl_write(conn, FIRSTSOCKET, conn->data->state.uploadbuffer,
                      len, &bytes_written);
  if(result)
    return result;

  if(bytes_written != len) {
    smbc->send_size = len;
    smbc->sent = bytes_written;
  }

  smbc->upload_size = upload_size;

  return CURLE_OK;
}